

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

void __thiscall
JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Reset(List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      *this)

{
  WriteBarrierPtr<Js::ReturnedValue> **ppWVar1;
  long *plVar2;
  long extraout_RDX;
  code *local_48;
  nullptr_t local_28;
  code *local_20;
  FreeFuncType freeFunc;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *local_10;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  
  local_10 = this;
  ppWVar1 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)
                       &(this->
                        super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                        buffer);
  if (*ppWVar1 != (WriteBarrierPtr<Js::ReturnedValue> *)0x0) {
    local_20 = (code *)Memory::ListTypeAllocatorFunc<Memory::Recycler,_false>::GetFreeFunc();
    plVar2 = (long *)((long)&((this->
                              super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>
                              ).alloc)->Cookie + extraout_RDX);
    local_48 = local_20;
    if (((ulong)local_20 & 1) != 0) {
      local_48 = *(code **)(local_20 + *plVar2 + -1);
    }
    ppWVar1 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                        ((WriteBarrierPtr *)
                         &(this->
                          super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>
                          ).buffer);
    (*local_48)(plVar2,*ppWVar1,(long)this->length << 3);
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::ReturnedValue>_>::operator=
              (&(this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                buffer,&local_28);
    (this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count = 0;
    this->length = 0;
  }
  return;
}

Assistant:

void Reset()
        {
            if (this->buffer != nullptr)
            {
                auto freeFunc = AllocatorInfo::GetFreeFunc();
                AllocatorFree(this->alloc, freeFunc, this->buffer, sizeof(T) * length); // TODO: Better version of DeleteArray?

                this->buffer = nullptr;
                this->count = 0;
                length = 0;
            }
        }